

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstepsolver.cpp
# Opt level: O2

void __thiscall
TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
          (TPZStepSolver<std::complex<long_double>_> *this,void **vtt,
          TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *refmat)

{
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_18;
  
  local_18 = (TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>)refmat->fRef;
  LOCK();
  ((local_18.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_18.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZMatrixSolver<std::complex<long_double>_>::TPZMatrixSolver
            (&this->super_TPZMatrixSolver<std::complex<long_double>_>,vtt + 1,&local_18);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_18);
  (this->super_TPZMatrixSolver<std::complex<long_double>_>).super_TPZSolver.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)*vtt;
  this->fNumIterations = -1;
  (this->fSingular).super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->fSingular;
  (this->fSingular).super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->fSingular;
  (this->fSingular).super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  this->fPrecond = (TPZMatrixSolver<std::complex<long_double>_> *)0x0;
  ResetSolver(this);
  return;
}

Assistant:

TPZStepSolver<TVar>::TPZStepSolver(TPZAutoPointer<TPZMatrix<TVar> > refmat) : TPZRegisterClassId(&TPZStepSolver::ClassId),TPZMatrixSolver<TVar>(refmat), fNumIterations(-1) {
	fPrecond = 0;
	ResetSolver();
}